

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.cpp
# Opt level: O2

void __thiscall duckdb::LogicalType::LogicalType(LogicalType *this,LogicalType *other)

{
  this->id_ = other->id_;
  this->physical_type_ = other->physical_type_;
  ::std::__shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2> *)&this->type_info_,
             (__shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2> *)&other->type_info_);
  return;
}

Assistant:

LogicalType::LogicalType(const LogicalType &other)
    : id_(other.id_), physical_type_(other.physical_type_), type_info_(other.type_info_) {
}